

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * openjtalk_getHTSVoiceName(OpenJTalk *oj,HtsVoiceFilelist *list,uint i,char *name)

{
  char *in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  HtsVoiceFilelist *temp;
  uint counter;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (in_RSI != (undefined8 *)0x0) {
    iVar1 = 0;
    for (; in_RSI != (undefined8 *)0x0; in_RSI = (undefined8 *)*in_RSI) {
      if (iVar1 == in_EDX) {
        if (in_RSI == (undefined8 *)0x0) {
          return (char *)0x0;
        }
        clear_path_string((char *)CONCAT44(iVar1 + 1,in_stack_ffffffffffffffd0),(size_t)in_RSI);
        strcpy(in_RCX,(char *)in_RSI[2]);
        return in_RCX;
      }
      iVar1 = iVar1 + 1;
    }
  }
  return (char *)0x0;
}

Assistant:

OPENJTALK_DLL_API char *OPENJTALK_CONVENTION openjtalk_getHTSVoiceName(OpenJTalk *oj, HtsVoiceFilelist *list, unsigned int i, char *name)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	if (list == NULL)
	{
		return NULL;
	}

	//HtsVoiceFilelist* temp = list;
	unsigned int counter = 0;
	for (HtsVoiceFilelist *temp = list; temp != NULL; temp = temp->succ)
	{
		if (counter++ == i)
		{
			if (temp)
			{
				clear_path_string(name, MAX_PATH);
				strcpy(name, temp->name);
				return name;
			}
			else
			{
				return NULL;
			}
		}
	}
	return NULL;
}